

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

StringRef __thiscall llbuild::buildsystem::BuildKey::getCustomTaskName(BuildKey *this)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  uint32_t nameSize;
  BuildKey *this_local;
  ulong local_28;
  
  bVar2 = isCustomTask(this);
  if (!bVar2) {
    __assert_fail("isCustomTask()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                  ,0xe6,"StringRef llbuild::buildsystem::BuildKey::getCustomTaskName() const");
  }
  pcVar3 = llbuild::core::KeyType::data(&this->key);
  uVar1 = *(uint *)(pcVar3 + 1);
  pcVar3 = llbuild::core::KeyType::data(&this->key);
  this_local = (BuildKey *)(pcVar3 + 5);
  local_28 = (ulong)uVar1;
  return _this_local;
}

Assistant:

StringRef getCustomTaskName() const {
    assert(isCustomTask());
    uint32_t nameSize;
    memcpy(&nameSize, &key.data()[1], sizeof(uint32_t));
    return StringRef(&key.data()[1 + sizeof(uint32_t)], nameSize);
  }